

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O2

void Imf_3_2::saveDeepScanLineImage
               (string *fileName,Header *hdr,DeepImage *img,DataWindowSource dws)

{
  char *pcVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  const_iterator cVar7;
  ConstIterator CVar8;
  string *psVar9;
  DeepScanLineOutputFile out;
  Header newHdr;
  DeepFrameBuffer fb;
  
  fb._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&newHdr,0x40,0x40,&fb,0,3);
  p_Var3 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  while( true ) {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var3 == p_Var4) break;
    p_Var4 = p_Var3 + 1;
    iVar2 = strcmp((char *)p_Var4,"dataWindow");
    if (iVar2 != 0) {
      iVar2 = strcmp((char *)p_Var4,"tiles");
      if (iVar2 != 0) {
        iVar2 = strcmp((char *)p_Var4,"channels");
        if (iVar2 != 0) {
          Imf_3_2::Header::insert((char *)&newHdr,(Attribute *)p_Var4);
        }
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  dataWindowForFile((Imf_3_2 *)&fb,hdr,&img->super_Image,dws);
  puVar5 = (undefined8 *)Imf_3_2::Header::dataWindow();
  *puVar5 = fb._map._M_t._M_impl._0_8_;
  puVar5[1] = fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  puVar6 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar6 = 2;
  iVar2 = (*(img->super_Image)._vptr_Image[4])(img,0);
  DeepFrameBuffer::DeepFrameBuffer(&fb);
  SampleCountChannel::slice((SampleCountChannel *)&out);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  cVar7._M_node = (_Base_ptr)DeepImageLevel::begin((DeepImageLevel *)CONCAT44(extraout_var,iVar2));
  while( true ) {
    CVar8 = DeepImageLevel::end((DeepImageLevel *)CONCAT44(extraout_var,iVar2));
    if ((const_iterator)cVar7._M_node == CVar8._i._M_node) break;
    psVar9 = (string *)Imf_3_2::Header::channels();
    _out = (_func_int **)ImageChannel::channel(*(ImageChannel **)(cVar7._M_node + 2));
    Imf_3_2::ChannelList::insert(psVar9,(Channel *)(cVar7._M_node + 1));
    (**(code **)(**(long **)(cVar7._M_node + 2) + 0x20))(&out);
    Imf_3_2::DeepFrameBuffer::insert((string *)&fb,(DeepSlice *)(cVar7._M_node + 1));
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
  }
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile(&out,pcVar1,&newHdr,iVar2);
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&out);
  Imf_3_2::Header::dataWindow();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::DeepScanLineOutputFile::writePixels((int)&out);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&out);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&fb);
  Imf_3_2::Header::~Header(&newHdr);
  return;
}

Assistant:

void
saveDeepScanLineImage (
    const string&    fileName,
    const Header&    hdr,
    const DeepImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    //XXX TODO: setting the compression to, for example,  ZIP_COMPRESSION,
    //then the OpenEXR library will save the file, but later it will not be
    //able to read it.  Fix the library!

    newHdr.compression () = ZIPS_COMPRESSION;

    const DeepImageLevel& level = img.level ();
    DeepFrameBuffer       fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
    {
        newHdr.channels ().insert (i.name (), i.channel ().channel ());
        fb.insert (i.name (), i.channel ().slice ());
    }

    DeepScanLineOutputFile out (fileName.c_str (), newHdr);
    out.setFrameBuffer (fb);
    out.writePixels (
        newHdr.dataWindow ().max.y - newHdr.dataWindow ().min.y + 1);
}